

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPoundName(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined1 uVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar4 = 7;
    if (bVar1 - 0xd8 < 4) goto LAB_004d80a7;
    if (bVar1 == 0) {
      bVar4 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      goto LAB_004d80a7;
    }
  }
  else {
    if (bVar1 - 0xdc < 4) {
      bVar4 = 8;
      goto LAB_004d80a7;
    }
    if ((bVar1 == 0xff) && (0xfd < (byte)ptr[1])) {
      bVar4 = 0;
      goto LAB_004d80a7;
    }
  }
  bVar4 = 0x1d;
LAB_004d80a7:
  iVar5 = 0;
  pbVar3 = (byte *)ptr;
  iVar6 = iVar5;
  if (bVar4 < 0x16) {
    if (bVar4 == 5) {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    }
    else if (bVar4 == 6) {
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
    }
    else {
      iVar6 = 0;
      if ((bVar4 == 7) && (iVar6 = iVar5, (long)end - (long)ptr < 4)) {
        return -2;
      }
    }
  }
  else if (((bVar4 == 0x16) || (bVar4 == 0x18)) ||
          ((bVar4 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[1] >> 3 & 0x1c |
                             (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >> ((byte)ptr[1] & 0x1f)
            & 1) != 0)))) {
    pbVar3 = (byte *)(ptr + 2);
    if (pbVar3 == (byte *)end) {
      return -0x14;
    }
    lVar7 = (long)end - (long)ptr;
    do {
      lVar7 = lVar7 + -2;
      bVar1 = *pbVar3;
      if (bVar1 < 0xdc) {
        uVar2 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar3[1]);
          }
          else {
LAB_004d81bf:
            uVar2 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar2 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (pbVar3[1] < 0xfe)) goto LAB_004d81bf;
        uVar2 = 0;
      }
      switch(uVar2) {
      case 5:
        if (lVar7 < 2) {
          return -2;
        }
        goto switchD_004d81d7_caseD_8;
      case 6:
        if (lVar7 < 3) {
          return -2;
        }
        goto switchD_004d81d7_caseD_8;
      case 7:
        if (lVar7 < 4) {
          return -2;
        }
      default:
        goto switchD_004d81d7_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        iVar6 = 0x14;
        goto switchD_004d81d7_caseD_8;
      case 0x1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(pbVar3[1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             (pbVar3[1] & 0x1f) & 1) == 0) goto switchD_004d81d7_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        pbVar3 = pbVar3 + 2;
        if (pbVar3 == (byte *)end) {
          return -0x14;
        }
      }
    } while( true );
  }
switchD_004d81d7_caseD_8:
  *nextTokPtr = (char *)pbVar3;
  return iVar6;
}

Assistant:

static
int PREFIX(scanPoundName)(const ENCODING *enc, const char *ptr, const char *end,
                          const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_CR: case BT_LF: case BT_S:
    case BT_RPAR: case BT_GT: case BT_PERCNT: case BT_VERBAR:
      *nextTokPtr = ptr;
      return XML_TOK_POUND_NAME;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -XML_TOK_POUND_NAME;
}